

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

bool anon_unknown.dwarf_10d9316::CheckGenExParameters
               (cmGeneratorExpressionContext *ctx,GeneratorExpressionContent *cnt,string_view genex,
               string_view option,size_t count,int required,bool exactly)

{
  char local_b3 [3];
  string_view option_local;
  string_view genex_local;
  char *local_90;
  string local_88;
  string local_68;
  string nbParameters;
  
  option_local._M_str = option._M_str;
  option_local._M_len = option._M_len;
  genex_local._M_str = genex._M_str;
  genex_local._M_len = genex._M_len;
  if (required < (int)count && exactly || required > (int)count) {
    nbParameters._M_dataplus._M_p = (pointer)&nbParameters.field_2;
    nbParameters._M_string_length = 0;
    nbParameters.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&nbParameters);
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_68,cnt);
    local_b3[2] = 0x3a;
    local_90 = "at least";
    if (exactly) {
      local_90 = "exactly";
    }
    local_b3[1] = 0x20;
    local_b3[0] = '.';
    cmStrCat<char_const(&)[3],std::basic_string_view<char,std::char_traits<char>>&,char,std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[23],char_const*,char,std::__cxx11::string&,char>
              (&local_88,(char (*) [3])0x6a4fd5,&genex_local,local_b3 + 2,&option_local,
               (char (*) [23])"> expression requires ",&local_90,local_b3 + 1,&nbParameters,local_b3
              );
    reportError(ctx,&local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&nbParameters);
  }
  return (required >= (int)count || !exactly) && required <= (int)count;
}

Assistant:

bool CheckGenExParameters(cmGeneratorExpressionContext* ctx,
                          const GeneratorExpressionContent* cnt,
                          cm::string_view genex, cm::string_view option,
                          std::size_t count, int required = 1,
                          bool exactly = true)
{
  if (static_cast<int>(count) < required ||
      (exactly && static_cast<int>(count) > required)) {
    std::string nbParameters;
    switch (required) {
      case 1:
        nbParameters = "one parameter";
        break;
      case 2:
        nbParameters = "two parameters";
        break;
      case 3:
        nbParameters = "three parameters";
        break;
      case 4:
        nbParameters = "four parameters";
        break;
      default:
        nbParameters = cmStrCat(std::to_string(required), " parameters");
    }
    reportError(ctx, cnt->GetOriginalExpression(),
                cmStrCat("$<", genex, ':', option, "> expression requires ",
                         (exactly ? "exactly" : "at least"), ' ', nbParameters,
                         '.'));
    return false;
  }
  return true;
}